

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O0

pint p_shm_buffer_read(PShmBuffer *buf,ppointer storage,psize len,PError **error)

{
  ulong uVar1;
  pboolean pVar2;
  ulong *puVar3;
  psize pVar4;
  size_t __n;
  ulong uVar5;
  bool bVar6;
  size_t local_78;
  psize first_part_size;
  ppointer addr;
  psize start_pos;
  psize to_copy;
  psize data_aval;
  psize write_pos;
  psize read_pos;
  PError **error_local;
  psize len_local;
  ppointer storage_local;
  PShmBuffer *buf_local;
  
  bVar6 = true;
  if ((buf != (PShmBuffer *)0x0) && (bVar6 = true, storage != (ppointer)0x0)) {
    bVar6 = len == 0;
  }
  if (bVar6) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    buf_local._4_4_ = -1;
  }
  else {
    puVar3 = (ulong *)p_shm_get_address(buf->shm);
    if (puVar3 == (ulong *)0x0) {
      p_error_set_error_p(error,0x25f,0,"Unable to get shared memory address");
      buf_local._4_4_ = -1;
    }
    else {
      pVar2 = p_shm_lock(buf->shm,error);
      if (pVar2 == 0) {
        buf_local._4_4_ = -1;
      }
      else {
        uVar1 = *puVar3;
        if (uVar1 == puVar3[1]) {
          pVar2 = p_shm_unlock(buf->shm,error);
          if (pVar2 == 0) {
            buf_local._4_4_ = -1;
          }
          else {
            buf_local._4_4_ = 0;
          }
        }
        else {
          pVar4 = pp_shm_buffer_get_used_space(buf);
          local_78 = len;
          if (pVar4 <= len) {
            local_78 = pVar4;
          }
          uVar5 = uVar1 % buf->size;
          if (buf->size < uVar5 + local_78) {
            __n = buf->size - uVar5;
            memcpy(storage,(void *)((long)puVar3 + uVar5 + 0x10),__n);
            memcpy((void *)((long)storage + __n),puVar3 + 2,local_78 - __n);
          }
          else {
            memcpy(storage,(void *)((long)puVar3 + uVar5 + 0x10),local_78);
          }
          *puVar3 = (uVar1 + local_78) % buf->size;
          pVar2 = p_shm_unlock(buf->shm,error);
          if (pVar2 == 0) {
            buf_local._4_4_ = -1;
          }
          else {
            buf_local._4_4_ = (pint)local_78;
          }
        }
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

P_LIB_API pint
p_shm_buffer_read (PShmBuffer	*buf,
		   ppointer	storage,
		   psize	len,
		   PError	**error)
{
	psize		read_pos;
	psize		write_pos;
	psize		data_aval;
	psize		to_copy;
	psize		start_pos;
	ppointer	addr;

	if (P_UNLIKELY (buf == NULL || storage == NULL || len == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY ((addr = p_shm_get_address (buf->shm)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Unable to get shared memory address");
		return -1;
	}

	if (P_UNLIKELY (p_shm_lock (buf->shm, error) == FALSE))
		return -1;

	memcpy (&read_pos, (pchar *) addr + P_SHM_BUFFER_READ_OFFSET, sizeof (read_pos));
	memcpy (&write_pos, (pchar *) addr + P_SHM_BUFFER_WRITE_OFFSET, sizeof (write_pos));

	if (read_pos == write_pos) {
		if (P_UNLIKELY (p_shm_unlock (buf->shm, error) == FALSE))
			return -1;

		return 0;
	}

	data_aval = pp_shm_buffer_get_used_space (buf);
	to_copy   = (data_aval <= len) ? data_aval : len;

	start_pos = read_pos % buf->size;

	if (start_pos + to_copy <= buf->size) {
		memcpy ((pchar *) storage, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET + start_pos, to_copy);
	} else {
		psize first_part_size = buf->size - start_pos;

		memcpy ((pchar *) storage, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET + start_pos, first_part_size);
		memcpy ((pchar *) storage + first_part_size, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET, to_copy - first_part_size);
	}

	read_pos = (read_pos + to_copy) % buf->size;
	memcpy ((pchar *) addr + P_SHM_BUFFER_READ_OFFSET, &read_pos, sizeof (read_pos));

	if (P_UNLIKELY (p_shm_unlock (buf->shm, error) == FALSE))
		return -1;

	return (pint) to_copy;
}